

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::EqualTest<unsigned_int,unsigned_short>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_3e;
  int local_3c;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  int local_34;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  int local_2c [2];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  int local_20;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1c;
  int local_18;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  
  local_18 = 3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_14,&local_18);
  if (local_14.m_int == 2) {
    local_20 = 4;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_1c,&local_20);
    if (local_1c.m_int == 5) {
      local_2c[1] = 6;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_24,local_2c + 1);
      local_2c[0] = 7;
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_3e,local_2c);
      if (local_24.m_int == local_3e.m_int) {
        local_34 = 1;
        SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_30,&local_34);
        if (local_30.m_int != 0) {
          local_3c = 0;
          SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    (&local_38,&local_3c);
          return local_38.m_int == 0;
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}